

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::SparsemaxLoss::forward_impl
          (SparsemaxLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  float fVar1;
  uint uVar2;
  Tensor *pTVar3;
  float *pfVar4;
  void *pvVar5;
  pointer ppTVar6;
  pointer puVar7;
  float fVar8;
  undefined1 auVar9 [16];
  runtime_error *this_00;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Index size;
  ulong uVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM5 [16];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> sm;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Tensor tsm;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  undefined1 local_78 [48];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_48;
  
  pTVar3 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (pTVar3->d).nd) && ((pTVar3->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"SparsemaxLoss not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = (pTVar3->d).d[0];
  uVar17 = (ulong)(int)uVar2;
  if (0x10000 < (long)uVar17) {
    std::operator<<((ostream *)&std::cerr,
                    "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.\n");
    abort();
  }
  pfVar4 = fx->v;
  pvVar5 = (this->super_Node).aux_mem;
  uVar11 = (ulong)((long)(this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 2;
  iVar10 = (int)uVar11;
  auVar9 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,iVar10);
  fVar20 = 1.0 / auVar9._0_4_;
  std::__partial_sort_copy<float*,float*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<float>>>
            (pTVar3->v,pTVar3->v + uVar17,pvVar5,(void *)((long)pvVar5 + uVar17 * 4));
  uVar13 = 0;
  fVar8 = 0.0;
  do {
    fVar21 = fVar8;
    uVar12 = uVar2;
    if (uVar2 == uVar13) goto LAB_001ae989;
    fVar1 = *(float *)((long)pvVar5 + uVar13 * 4);
    uVar13 = uVar13 + 1;
    fVar8 = fVar1 + fVar21;
    auVar22 = vcvtusi2ss_avx512f(in_XMM5,(int)uVar13);
    auVar22 = vfmadd213ss_fma(auVar22,ZEXT416((uint)fVar1),SUB6416(ZEXT464(0x3f800000),0));
  } while (fVar8 < auVar22._0_4_);
  uVar12 = (int)uVar13 - 1;
LAB_001ae989:
  ppTVar6 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar3 = *ppTVar6;
  local_78._40_8_ = (this->super_Node).aux_mem;
  local_78._32_4_ = (pTVar3->d).bd;
  local_78._0_8_ = *(undefined8 *)(pTVar3->d).d;
  local_78._8_8_ = *(undefined8 *)((pTVar3->d).d + 2);
  local_78._16_8_ = *(undefined8 *)((pTVar3->d).d + 4);
  local_78._24_8_ = *(undefined8 *)((pTVar3->d).d + 6);
  local_48.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_48.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Tensor::operator*(&local_98,*ppTVar6);
  Tensor::operator*(&local_b8,(Tensor *)local_78);
  if ((int)uVar2 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                 );
  }
  if ((local_98.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value != uVar17) ||
     (local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value != 1)) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>>]"
                 );
  }
  if ((local_b8.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value != uVar17) ||
     (local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value != 1)) {
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                 );
  }
  auVar22 = vcvtusi2ss_avx512f(in_XMM5,uVar12);
  uVar13 = uVar17;
  if ((((ulong)local_b8.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data & 3) == 0) &&
     (uVar13 = (ulong)(-((uint)((ulong)local_b8.
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                       .
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                       .m_data >> 2) & 0x3fffffff) & 0xf),
     (long)uVar17 <= (long)uVar13)) {
    uVar13 = uVar17;
  }
  auVar22._0_4_ = (fVar21 + -1.0) / auVar22._0_4_;
  auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
  uVar15 = uVar17 - uVar13;
  uVar14 = uVar15 + 0xf;
  if (-1 < (long)uVar15) {
    uVar14 = uVar15;
  }
  if (0 < (long)uVar13) {
    uVar16 = 0;
    do {
      auVar23 = vmaxss_avx(ZEXT416((uint)(local_98.
                                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                          .
                                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                          .m_data[uVar16] - auVar22._0_4_)),ZEXT816(0) << 0x20);
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data[uVar16] = auVar23._0_4_;
      uVar16 = uVar16 + 1;
    } while (uVar13 != uVar16);
  }
  uVar14 = (uVar14 & 0xfffffffffffffff0) + uVar13;
  if (0xf < (long)uVar15) {
    auVar18 = vbroadcastss_avx512f(auVar22);
    do {
      auVar19 = vsubps_avx512f(*(undefined1 (*) [64])
                                (local_98.
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 .
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                 .m_data + uVar13),auVar18);
      auVar19 = vmaxps_avx512f(auVar19,ZEXT1664(ZEXT816(0) << 0x40));
      *(undefined1 (*) [64])
       (local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data + uVar13) = auVar19;
      uVar13 = uVar13 + 0x10;
    } while ((long)uVar13 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar17) {
    do {
      auVar23 = vmaxss_avx(ZEXT416((uint)(local_98.
                                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                          .
                                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                          .m_data[uVar14] - auVar22._0_4_)),ZEXT816(0) << 0x40);
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data[uVar14] = auVar23._0_4_;
      uVar14 = uVar14 + 1;
    } while (uVar17 != uVar14);
  }
  *pfVar4 = 0.0;
  if (uVar2 == 0) {
    auVar23._12_4_ = 0;
    auVar23._0_12_ = ZEXT812(0);
    auVar23 = auVar23 << 0x20;
  }
  else {
    auVar18 = ZEXT1264(ZEXT812(0)) << 0x20;
    uVar13 = 0;
    do {
      if (uVar17 == uVar13) goto LAB_001aebbc;
      if (local_b8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data[uVar13] != 0.0) {
        auVar23 = vfmsub213ss_fma(ZEXT416((uint)local_98.
                                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                .
                                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                .m_data[uVar13]),
                                  ZEXT416((uint)local_98.
                                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                .
                                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                .m_data[uVar13]),
                                  ZEXT416((uint)(auVar22._0_4_ * auVar22._0_4_)));
        fVar8 = auVar18._0_4_ + auVar23._0_4_;
        auVar18 = ZEXT464((uint)fVar8);
        *pfVar4 = fVar8;
      }
      auVar23 = auVar18._0_16_;
      uVar13 = uVar13 + 1;
    } while (uVar2 != uVar13);
  }
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)auVar9._0_4_),ZEXT416((uint)(fVar20 * fVar20)),auVar23);
  fVar8 = auVar9._0_4_ * 0.5;
  auVar18 = ZEXT464((uint)fVar8);
  *pfVar4 = fVar8;
  if (iVar10 != 0) {
    uVar13 = 0;
    puVar7 = (this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar14 = (ulong)puVar7[uVar13];
      if ((long)uVar17 <= (long)uVar14) {
LAB_001aebbc:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                     );
      }
      auVar9 = vfnmadd231ss_fma(auVar18._0_16_,ZEXT416((uint)fVar20),
                                ZEXT416((uint)local_98.
                                              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                              .
                                              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                              .m_data[uVar14]));
      auVar18 = ZEXT1664(auVar9);
      uVar13 = uVar13 + 1;
      *pfVar4 = auVar9._0_4_;
    } while ((uVar11 & 0xffffffff) != uVar13);
  }
  if (auVar18._0_4_ < 0.0) {
    *pfVar4 = 0.0;
  }
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
  return;
}

Assistant:

void SparsemaxLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
#if HAVE_CUDA
    throw std::runtime_error("SparsemaxLoss not implemented on GPU");
#else
    const int rows = xs[0]->d.rows();
    if (rows > MAX_SPARSEMAX_LOSS_ROWS) {
      cerr << "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.\n";
      abort();
    }
    float& y = fx.v[0];  // loss
    const unsigned qsupport_size = pq->size();
    const float qprop = 1.f / qsupport_size;

    float *zs = static_cast<float*>(aux_mem);
    std::partial_sort_copy(xs[0]->v, xs[0]->v+rows, zs, zs + rows, std::greater<float>());
    float sum = 0, maxsum = 0;
    unsigned k = 0;
    for (k = 0; k < rows; ++k) {
      sum += zs[k];
      float t = 1 + (k + 1) * zs[k];
      if (t <= sum) break;
      maxsum = sum;
    }
    float tau = (maxsum - 1) / k;
    Tensor tsm(xs[0]->d, (float*)aux_mem);
    auto x = **xs[0];
    auto sm = *tsm;
    sm = (x - Eigen::MatrixXf::Ones(rows, 1)*tau).cwiseMax(0.f);
    //cerr << "SpM: " << (sm).transpose() << " |||";
    //for (unsigned i = 0; i < pq->size(); ++i) cerr << ' ' << (*pq)[i];
    //cerr << endl;
    y = 0;
    float tau_sq = tau * tau;
    for (unsigned i = 0; i < rows; ++i) {
      if (sm(i, 0)) {
        const float x_s = x(i, 0);
        y += x_s * x_s - tau_sq;
      }
    }
    y /= 2;
    y += qprop * qprop * qsupport_size / 2;
    for (unsigned i = 0; i < qsupport_size; ++i)
      y -= qprop * x((*pq)[i], 0);
    if (y < 0) y = 0;
#endif
  } else {
    throw std::runtime_error("SparsemaxLoss not yet implemented for multiple columns");
  }
}